

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::TraverseSchema::getLocalPart(TraverseSchema *this,XMLCh *rawName)

{
  XMLStringPool *pXVar1;
  int iVar2;
  uint uVar3;
  XMLSize_t count;
  undefined4 extraout_var;
  
  iVar2 = XMLString::indexOf(rawName,L':');
  count = XMLString::stringLen(rawName);
  if (count != (long)(iVar2 + 1)) {
    if (iVar2 != -1) {
      rawName = rawName + (long)iVar2 + 1;
      count = count + ~(long)iVar2;
    }
    XMLBuffer::set(&this->fBuffer,rawName,count);
    pXVar1 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1);
    iVar2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
    return (XMLCh *)CONCAT44(extraout_var,iVar2);
  }
  return L"";
}

Assistant:

inline const XMLCh* TraverseSchema::getLocalPart(const XMLCh* const rawName) {

    int    colonIndex = XMLString::indexOf(rawName, chColon);
    XMLSize_t rawNameLen = XMLString::stringLen(rawName);

    if (XMLSize_t(colonIndex + 1) == rawNameLen) {
        return XMLUni::fgZeroLenString;
    }

    if (colonIndex == -1) {
        fBuffer.set(rawName, rawNameLen);
    }
    else {

        fBuffer.set(rawName + colonIndex + 1, rawNameLen - colonIndex - 1);
    }

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}